

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# View.cpp
# Opt level: O2

void __thiscall sf::View::View(View *this)

{
  FloatRect local_18;
  
  *(undefined8 *)&(this->m_size).y = 0;
  (this->m_viewport).left = 0.0;
  (this->m_viewport).top = 0.0;
  (this->m_center).x = 0.0;
  (this->m_center).y = 0.0;
  (this->m_size).x = 0.0;
  (this->m_size).y = 0.0;
  (this->m_viewport).width = 1.0;
  (this->m_viewport).height = 1.0;
  Transform::Transform(&this->m_transform);
  Transform::Transform(&this->m_inverseTransform);
  this->m_transformUpdated = false;
  this->m_invTransformUpdated = false;
  local_18.left = 0.0;
  local_18.top = 0.0;
  local_18.width = 1000.0;
  local_18.height = 1000.0;
  reset(this,&local_18);
  return;
}

Assistant:

View::View() :
m_center             (),
m_size               (),
m_rotation           (0),
m_viewport           (0, 0, 1, 1),
m_transformUpdated   (false),
m_invTransformUpdated(false)
{
    reset(FloatRect(0, 0, 1000, 1000));
}